

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  size_t i;
  long lVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  iVar1 = *(int *)this;
  if (iVar1 == 1) {
    pcVar5 = "no surjection from elements to requirements exists such that:\n";
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        lVar6 = *(long *)(this + 8);
        lVar2 = *(long *)(this + 0x10);
        if (lVar6 == lVar2) {
          std::operator<<(os,"isn\'t empty");
          return;
        }
        poVar4 = std::operator<<(os,"doesn\'t have ");
        if (lVar2 - lVar6 == 8) {
          Elements((UnorderedElementsAreMatcherImplBase *)&local_40,1);
          poVar4 = testing::operator<<(poVar4,(Message *)&local_40);
          poVar4 = std::operator<<(poVar4,", or has ");
          Elements((UnorderedElementsAreMatcherImplBase *)&local_38,1);
          poVar4 = testing::operator<<(poVar4,(Message *)&local_38);
          std::operator<<(poVar4," that ");
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_38);
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_40);
          (**(code **)(*(long *)**(undefined8 **)(this + 8) + 0x18))
                    ((long *)**(undefined8 **)(this + 8),os);
          return;
        }
        Elements((UnorderedElementsAreMatcherImplBase *)&local_40,
                 *(long *)(this + 0x10) - *(long *)(this + 8) >> 3);
        poVar4 = testing::operator<<(poVar4,(Message *)&local_40);
        std::operator<<(poVar4,", or there exists no permutation of elements such that:\n");
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_40);
      }
      goto LAB_00122bb4;
    }
    pcVar5 = "no injection from elements to requirements exists such that:\n";
  }
  std::operator<<(os,pcVar5);
LAB_00122bb4:
  pcVar5 = "";
  for (lVar6 = 0; lVar6 != *(long *)(this + 0x10) - *(long *)(this + 8) >> 3; lVar6 = lVar6 + 1) {
    std::operator<<(os,pcVar5);
    if (*(int *)this == 3) {
      poVar4 = std::operator<<(os," - element #");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      pcVar5 = " ";
    }
    else {
      pcVar5 = " - an element ";
      poVar4 = os;
    }
    std::operator<<(poVar4,pcVar5);
    plVar3 = *(long **)(*(long *)(this + 8) + lVar6 * 8);
    (**(code **)(*plVar3 + 0x10))(plVar3,os);
    pcVar5 = "\n";
    if (*(int *)this == 3) {
      pcVar5 = ", and\n";
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "isn't empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "doesn't have " << Elements(1) << ", or has " << Elements(1)
            << " that ";
        matcher_describers_[0]->DescribeNegationTo(os);
        return;
      }
      *os << "doesn't have " << Elements(matcher_describers_.size())
          << ", or there exists no permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "no surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "no injection from elements to requirements exists such that:\n";
      break;
  }
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}